

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O2

bool __thiscall
QNativeSocketEngine::leaveMulticastGroup
          (QNativeSocketEngine *this,QHostAddress *groupAddress,QNetworkInterface *iface)

{
  QNativeSocketEnginePrivate *this_00;
  char cVar1;
  bool bVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QNativeSocketEnginePrivate **)(this + 8);
  cVar1 = (**(code **)(*(long *)this + 0x78))();
  if (cVar1 == '\0') {
    pcVar3 = 
    "QNativeSocketEngine::leaveMulticastGroup() was called on an uninitialized socket device";
  }
  else if ((this_00->super_QAbstractSocketEnginePrivate).socketState == BoundState) {
    if ((this_00->super_QAbstractSocketEnginePrivate).socketType == UdpSocket) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        bVar2 = QNativeSocketEnginePrivate::nativeLeaveMulticastGroup(this_00,groupAddress,iface);
        return bVar2;
      }
      goto LAB_001b8b99;
    }
    pcVar3 = 
    "QNativeSocketEngine::leaveMulticastGroup() was called by a socket other than QAbstractSocket::UdpSocket"
    ;
  }
  else {
    pcVar3 = 
    "QNativeSocketEngine::leaveMulticastGroup() was not called in QAbstractSocket::BoundState";
  }
  local_28 = "default";
  local_40[0x14] = '\0';
  local_40[0x15] = '\0';
  local_40[0x16] = '\0';
  local_40[0x17] = '\0';
  local_40[0xc] = '\0';
  local_40[0xd] = '\0';
  local_40[0xe] = '\0';
  local_40[0xf] = '\0';
  local_40[0x10] = '\0';
  local_40[0x11] = '\0';
  local_40[0x12] = '\0';
  local_40[0x13] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = '\0';
  local_40[8] = '\0';
  local_40[9] = '\0';
  local_40[10] = '\0';
  local_40[0xb] = '\0';
  local_40[0] = '\x02';
  local_40[1] = '\0';
  local_40[2] = '\0';
  local_40[3] = '\0';
  QMessageLogger::warning(local_40,pcVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return false;
  }
LAB_001b8b99:
  __stack_chk_fail();
}

Assistant:

bool QNativeSocketEngine::leaveMulticastGroup(const QHostAddress &groupAddress,
                                              const QNetworkInterface &iface)
{
    Q_D(QNativeSocketEngine);
    Q_CHECK_VALID_SOCKETLAYER(QNativeSocketEngine::leaveMulticastGroup(), false);
    Q_CHECK_STATE(QNativeSocketEngine::leaveMulticastGroup(), QAbstractSocket::BoundState, false);
    Q_CHECK_TYPE(QNativeSocketEngine::leaveMulticastGroup(), QAbstractSocket::UdpSocket, false);
    return d->nativeLeaveMulticastGroup(groupAddress, iface);
}